

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall
GrcManager::CreateAutoPseudoGlyphDefn(GrcManager *this,utf16 wAssigned,int nUnicode,gid16 wGlyphID)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  iterator __position_00;
  pointer pcVar2;
  GdlGlyphClassMember *pglfd;
  GdlGlyphClassDefn *this_00;
  GrpLineAndFile lnf;
  unsigned_short local_56;
  uint local_54;
  GrpLineAndFile local_50;
  
  local_56 = wAssigned;
  pcVar2 = (pointer)operator_new(0xb0);
  GdlObject::GdlObject((GdlObject *)(pcVar2 + 8));
  pcVar2[0x30] = -1;
  pcVar2[0x31] = -1;
  pcVar2[0x32] = -1;
  pcVar2[0x33] = -1;
  pcVar2[0x34] = '\x02';
  pcVar2[0x35] = '\0';
  pcVar2[0x36] = '\0';
  pcVar2[0x37] = '\0';
  *(undefined ***)pcVar2 = &PTR__GdlGlyphDefn_00241c30;
  *(uint *)(pcVar2 + 0x38) = (uint)wGlyphID;
  *(uint *)(pcVar2 + 0x3c) = (uint)wGlyphID;
  pcVar2[0x40] = '\0';
  pcVar2[0x41] = '\0';
  pcVar2[0x44] = '\0';
  pcVar2[0x45] = '\0';
  pcVar2[0x46] = '\0';
  pcVar2[0x47] = '\0';
  pcVar2[0x48] = '\0';
  pcVar2[0x49] = '\0';
  pcVar2[0x4a] = '\0';
  pcVar2[0x4b] = '\0';
  pcVar2[0x4c] = '\0';
  pcVar2[0x4d] = '\0';
  pcVar2[0x4e] = '\0';
  pcVar2[0x4f] = '\0';
  *(pointer *)(pcVar2 + 0x50) = pcVar2 + 0x60;
  pcVar2[0x58] = '\0';
  pcVar2[0x59] = '\0';
  pcVar2[0x5a] = '\0';
  pcVar2[0x5b] = '\0';
  pcVar2[0x5c] = '\0';
  pcVar2[0x5d] = '\0';
  pcVar2[0x5e] = '\0';
  pcVar2[0x5f] = '\0';
  pcVar2[0x60] = '\0';
  pcVar2[0x70] = '\0';
  pcVar2[0x71] = '\0';
  pcVar2[0x72] = '\0';
  pcVar2[0x73] = '\0';
  pcVar2[0x74] = '\0';
  pcVar2[0x75] = '\0';
  pcVar2[0x76] = '\0';
  pcVar2[0x77] = '\0';
  pcVar2[0x78] = '\0';
  pcVar2[0x79] = '\0';
  pcVar2[0x7a] = '\0';
  pcVar2[0x7b] = '\0';
  pcVar2[0x7c] = '\0';
  pcVar2[0x7d] = '\0';
  pcVar2[0x7e] = '\0';
  pcVar2[0x7f] = '\0';
  pcVar2[0x80] = '\0';
  pcVar2[0x81] = '\0';
  pcVar2[0x82] = '\0';
  pcVar2[0x83] = '\0';
  pcVar2[0x84] = '\0';
  pcVar2[0x85] = '\0';
  pcVar2[0x86] = '\0';
  pcVar2[0x87] = '\0';
  pcVar2[0x90] = '\0';
  pcVar2[0x91] = '\0';
  pcVar2[0x92] = '\0';
  pcVar2[0x93] = '\0';
  pcVar2[0x94] = '\0';
  pcVar2[0x95] = '\0';
  pcVar2[0x96] = '\0';
  pcVar2[0x97] = '\0';
  pcVar2[0x98] = '\0';
  pcVar2[0x99] = '\0';
  pcVar2[0x9a] = '\0';
  pcVar2[0x9b] = '\0';
  pcVar2[0x9c] = '\0';
  pcVar2[0x9d] = '\0';
  pcVar2[0x9e] = '\0';
  pcVar2[0x9f] = '\0';
  pcVar2[0x9a] = '\0';
  pcVar2[0x9b] = '\0';
  pcVar2[0x9c] = '\0';
  pcVar2[0x9d] = '\0';
  pcVar2[0x9e] = '\0';
  pcVar2[0x9f] = '\0';
  pcVar2[0xa0] = '\0';
  pcVar2[0xa1] = '\0';
  pcVar2[0xa2] = '\0';
  pcVar2[0xa3] = '\0';
  pcVar2[0xa4] = '\0';
  pcVar2[0xa5] = '\0';
  pcVar2[0xa6] = '\0';
  pcVar2[0xa7] = '\0';
  pcVar2[0xa8] = '\0';
  pcVar2[0xa9] = '\0';
  pglfd = (GdlGlyphClassMember *)operator_new(0xb0);
  GdlObject::GdlObject(&(pglfd->super_GdlDefn).super_GdlObject);
  (pglfd->super_GdlDefn)._vptr_GdlDefn = (_func_int **)&PTR__GdlGlyphDefn_00241c30;
  *(undefined8 *)&pglfd->m_fIsSpaceGlyph = 0x5ffffffff;
  pglfd[1].super_GdlDefn._vptr_GdlDefn = (_func_int **)0x0;
  *(undefined2 *)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = nUnicode;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = pcVar2;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_string_length =
       (size_type)((long)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8);
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_local_buf[8] = '\0';
  pglfd[2].super_GdlDefn._vptr_GdlDefn = (_func_int **)0x0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8) = 0;
  *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 9) = 0;
  *(undefined8 *)((long)&pglfd[2].m_fIsSpaceGlyph + 1) = 0;
  *(unsigned_short *)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_string_length =
       local_56;
  this_00 = (GdlGlyphClassDefn *)operator_new(0x110);
  GdlGlyphClassDefn::GdlGlyphClassDefn(this_00);
  paVar1 = &local_50.m_staFile.field_2;
  local_50.m_nLinePre = -1;
  local_50.m_nLineOrig = -1;
  local_50.m_staFile._M_string_length = 0;
  local_50.m_staFile.field_2._M_local_buf[0] = '\0';
  local_50.m_staFile._M_dataplus._M_p = (pointer)paVar1;
  GdlGlyphClassDefn::AddMember(this_00,pglfd,&local_50);
  GdlRenderer::AddGlyphClass(this->m_prndr,this_00);
  __position._M_current =
       (this->m_vnUnicodeForPseudo).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_54 = nUnicode;
  if (__position._M_current ==
      (this->m_vnUnicodeForPseudo).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->m_vnUnicodeForPseudo,__position,&local_54);
  }
  else {
    *__position._M_current = nUnicode;
    (this->m_vnUnicodeForPseudo).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (this->m_vwPseudoForUnicode).
       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_vwPseudoForUnicode).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_realloc_insert<unsigned_short_const&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vwPseudoForUnicode,
               __position_00,&local_56);
  }
  else {
    *__position_00._M_current = local_56;
    (this->m_vwPseudoForUnicode).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_staFile._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.m_staFile._M_dataplus._M_p,
                    CONCAT71(local_50.m_staFile.field_2._M_allocated_capacity._1_7_,
                             local_50.m_staFile.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void GrcManager::CreateAutoPseudoGlyphDefn(utf16 wAssigned, int nUnicode, gid16 wGlyphID)
{
	GdlGlyphDefn * pglfOutput = new GdlGlyphDefn(kglftGlyphID, wGlyphID);
	GdlGlyphDefn * pglf = new GdlGlyphDefn(kglftPseudo, pglfOutput, nUnicode);
	pglf->SetAssignedPseudo(wAssigned);

	GdlGlyphClassDefn * pglfc = new GdlGlyphClassDefn();
	GrpLineAndFile lnf;	// bogus
	pglfc->AddMember(pglf, lnf);
	m_prndr->AddGlyphClass(pglfc);
	
	m_vnUnicodeForPseudo.push_back(nUnicode);
	m_vwPseudoForUnicode.push_back(wAssigned);
}